

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_extension.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::ExtensionGenerator::ExtensionGenerator
          (ExtensionGenerator *this,FieldDescriptor *descriptor,Options *options,
          MessageSCCAnalyzer *scc_analyzer)

{
  string *psVar1;
  _func_void_FieldDescriptor_ptr *buffer;
  _func_void_FieldDescriptor_ptr *p_Var2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  _Rb_tree_header *p_Var3;
  int iVar4;
  long lVar5;
  bool bVar6;
  EnumDescriptor *pEVar7;
  Descriptor *pDVar8;
  mapped_type *pmVar9;
  LogMessage *other;
  long *plVar10;
  Options *options_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  Descriptor *extraout_RDX_02;
  Descriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *pFVar12;
  char *pcVar13;
  string scope;
  string name;
  undefined1 local_100 [56];
  key_type local_c8;
  undefined1 local_a8 [32];
  cpp *local_88;
  undefined1 local_80 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  string *local_58;
  undefined1 local_50 [32];
  
  this->descriptor_ = descriptor;
  psVar1 = &this->type_traits_;
  local_60 = &(this->type_traits_).field_2;
  (this->type_traits_)._M_dataplus._M_p = (pointer)local_60;
  (this->type_traits_)._M_string_length = 0;
  (this->type_traits_).field_2._M_local_buf[0] = '\0';
  local_88 = (cpp *)&this->options_;
  local_58 = psVar1;
  Options::Options((Options *)local_88,options);
  this->scc_analyzer_ = scc_analyzer;
  variables = &this->variables_;
  p_Var3 = &(this->variables_)._M_t._M_impl.super__Rb_tree_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  options_00 = (Options *)0x0;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pFVar12 = this->descriptor_;
  if ((~(byte)pFVar12[1] & 0x60) == 0) {
    options_00 = (Options *)0x4295d9;
    std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)(this->type_traits_)._M_string_length,0x4295d9);
    pFVar12 = this->descriptor_;
  }
  if (*(once_flag **)(pFVar12 + 0x18) != (once_flag *)0x0) {
    local_100._0_8_ = FieldDescriptor::TypeOnceInit;
    local_80._0_8_ = pFVar12;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar12 + 0x18),(_func_void_FieldDescriptor_ptr **)local_100,
               (FieldDescriptor **)local_80);
  }
  iVar4 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar12[2] * 4);
  if (iVar4 == 10) {
    std::__cxx11::string::append((char *)psVar1);
    pDVar8 = FieldDescriptor::message_type(this->descriptor_);
    ClassName_abi_cxx11_((string *)local_100,(cpp *)pDVar8,(Descriptor *)0x1,SUB81(options_00,0));
    std::__cxx11::string::_M_append((char *)psVar1,local_100._0_8_);
  }
  else {
    if (iVar4 == 9) goto LAB_002dcade;
    if (iVar4 == 8) {
      std::__cxx11::string::append((char *)psVar1);
      pEVar7 = FieldDescriptor::enum_type(this->descriptor_);
      ClassName_abi_cxx11_
                ((string *)local_100,(cpp *)pEVar7,(EnumDescriptor *)0x1,SUB81(options_00,0));
      std::__cxx11::string::_M_append((char *)psVar1,local_100._0_8_);
      if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
        operator_delete((void *)local_100._0_8_);
      }
      std::__cxx11::string::append((char *)psVar1);
      pEVar7 = FieldDescriptor::enum_type(this->descriptor_);
      ClassName_abi_cxx11_
                ((string *)local_100,(cpp *)pEVar7,(EnumDescriptor *)0x1,SUB81(options_00,0));
      std::__cxx11::string::_M_append((char *)psVar1,local_100._0_8_);
      if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
        operator_delete((void *)local_100._0_8_);
      }
      goto LAB_002dcade;
    }
    std::__cxx11::string::append((char *)psVar1);
    pFVar12 = this->descriptor_;
    if (*(once_flag **)(pFVar12 + 0x18) != (once_flag *)0x0) {
      local_80._0_8_ = FieldDescriptor::TypeOnceInit;
      local_c8._M_dataplus._M_p = (pointer)pFVar12;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar12 + 0x18),(_func_void_FieldDescriptor_ptr **)local_80,
                 (FieldDescriptor **)&local_c8);
    }
    PrimitiveTypeName_abi_cxx11_
              ((string *)local_100,local_88,
               (Options *)
               (ulong)*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar12[2] * 4),
               (CppType)options_00);
    std::__cxx11::string::_M_append((char *)psVar1,local_100._0_8_);
  }
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_);
  }
LAB_002dcade:
  std::__cxx11::string::append((char *)psVar1);
  SetCommonVars(options,variables);
  QualifiedClassName_abi_cxx11_
            ((string *)local_100,*(cpp **)(this->descriptor_ + 0x20),(Descriptor *)local_88,
             options_00);
  pFVar12 = (FieldDescriptor *)(local_80 + 0x10);
  local_80._0_8_ = pFVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"extendee","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_80);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)local_100);
  if ((FieldDescriptor *)local_80._0_8_ != pFVar12) {
    operator_delete((void *)local_80._0_8_);
  }
  buffer = (_func_void_FieldDescriptor_ptr *)(local_100 + 0x10);
  if ((_func_void_FieldDescriptor_ptr *)local_100._0_8_ != buffer) {
    operator_delete((void *)local_100._0_8_);
  }
  local_100._0_8_ = buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"type_traits","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_100);
  std::__cxx11::string::_M_assign((string *)pmVar9);
  if ((_func_void_FieldDescriptor_ptr *)local_100._0_8_ != buffer) {
    operator_delete((void *)local_100._0_8_);
  }
  lVar5 = **(long **)(this->descriptor_ + 8);
  local_80._0_8_ = pFVar12;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,lVar5,(*(long **)(this->descriptor_ + 8))[1] + lVar5);
  ResolveKeyword((string *)local_100,(string *)local_80);
  paVar11 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"name","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_c8);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)local_100);
  pFVar12 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar11) {
    operator_delete(local_c8._M_dataplus._M_p);
    pFVar12 = extraout_RDX_00;
  }
  if ((_func_void_FieldDescriptor_ptr *)local_100._0_8_ != buffer) {
    operator_delete((void *)local_100._0_8_);
    pFVar12 = extraout_RDX_01;
  }
  FieldConstantName_abi_cxx11_((string *)local_100,(cpp *)this->descriptor_,pFVar12);
  local_c8._M_dataplus._M_p = (pointer)paVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"constant_name","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_c8);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar11) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((_func_void_FieldDescriptor_ptr *)local_100._0_8_ != buffer) {
    operator_delete((void *)local_100._0_8_);
  }
  pFVar12 = this->descriptor_;
  if (*(once_flag **)(pFVar12 + 0x18) != (once_flag *)0x0) {
    local_a8._0_8_ = FieldDescriptor::TypeOnceInit;
    local_50._0_8_ = pFVar12;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar12 + 0x18),(_func_void_FieldDescriptor_ptr **)local_a8,
               (FieldDescriptor **)local_50);
  }
  local_100._0_8_ = buffer;
  local_100._8_8_ = FastInt32ToBufferLeft((uint)(byte)pFVar12[2],(char *)buffer);
  local_100._8_8_ = local_100._8_8_ + -(long)buffer;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,local_100._0_8_,(char *)(local_100._8_8_ + local_100._0_8_));
  p_Var2 = (_func_void_FieldDescriptor_ptr *)(local_a8 + 0x10);
  local_a8._0_8_ = p_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"field_type","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_a8);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_c8);
  if ((_func_void_FieldDescriptor_ptr *)local_a8._0_8_ != p_Var2) {
    operator_delete((void *)local_a8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  bVar6 = FieldDescriptor::is_packed(this->descriptor_);
  pcVar13 = "false";
  if (bVar6) {
    pcVar13 = "true";
  }
  local_100._0_8_ = buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"packed","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_100);
  std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,(ulong)pcVar13);
  if ((_func_void_FieldDescriptor_ptr *)local_100._0_8_ != buffer) {
    operator_delete((void *)local_100._0_8_);
  }
  bVar6 = IsScoped(this);
  if (bVar6) {
    pFVar12 = this->descriptor_;
    pDVar8 = extraout_RDX_02;
    if (((byte)pFVar12[1] & 8) == 0) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.h"
                 ,0x8d0);
      other = internal::LogMessage::operator<<
                        ((LogMessage *)local_100,"CHECK failed: is_extension_: ");
      internal::LogFinisher::operator=((LogFinisher *)local_50,other);
      internal::LogMessage::~LogMessage((LogMessage *)local_100);
      pDVar8 = extraout_RDX_03;
    }
    ClassName_abi_cxx11_((string *)local_a8,*(cpp **)(pFVar12 + 0x28),pDVar8);
    plVar10 = (long *)std::__cxx11::string::append(local_a8);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 == paVar11) {
      local_c8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_c8.field_2._8_8_ = plVar10[3];
    }
    else {
      local_c8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_c8._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_c8._M_string_length = plVar10[1];
    *plVar10 = (long)paVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((_func_void_FieldDescriptor_ptr *)local_a8._0_8_ != p_Var2) {
      operator_delete((void *)local_a8._0_8_);
    }
  }
  else {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
  }
  local_100._0_8_ = buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"scope","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_100);
  std::__cxx11::string::_M_assign((string *)pmVar9);
  pFVar12 = extraout_RDX_04;
  if ((_func_void_FieldDescriptor_ptr *)local_100._0_8_ != buffer) {
    operator_delete((void *)local_100._0_8_);
    pFVar12 = extraout_RDX_05;
  }
  ExtensionName_abi_cxx11_((string *)local_100,(cpp *)this->descriptor_,pFVar12);
  local_a8._0_8_ = p_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"scoped_name","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_a8);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)local_100);
  if ((_func_void_FieldDescriptor_ptr *)local_a8._0_8_ != p_Var2) {
    operator_delete((void *)local_a8._0_8_);
  }
  if ((_func_void_FieldDescriptor_ptr *)local_100._0_8_ != buffer) {
    operator_delete((void *)local_100._0_8_);
  }
  local_100._0_8_ = buffer;
  local_100._8_8_ = FastInt32ToBufferLeft(*(int32 *)(this->descriptor_ + 4),(char *)buffer);
  local_100._8_8_ = local_100._8_8_ + -(long)buffer;
  local_a8._0_8_ = p_Var2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,local_100._0_8_,(char *)(local_100._8_8_ + local_100._0_8_));
  local_50._0_8_ = (FieldDescriptor *)(local_50 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"number","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_50);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)local_a8);
  if ((FieldDescriptor *)local_50._0_8_ != (FieldDescriptor *)(local_50 + 0x10)) {
    operator_delete((void *)local_50._0_8_);
  }
  if ((_func_void_FieldDescriptor_ptr *)local_a8._0_8_ != p_Var2) {
    operator_delete((void *)local_a8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((FieldDescriptor *)local_80._0_8_ != (FieldDescriptor *)(local_80 + 0x10)) {
    operator_delete((void *)local_80._0_8_);
  }
  return;
}

Assistant:

ExtensionGenerator::ExtensionGenerator(const FieldDescriptor* descriptor,
                                       const Options& options,
                                       MessageSCCAnalyzer* scc_analyzer)
    : descriptor_(descriptor), options_(options), scc_analyzer_(scc_analyzer) {
  // Construct type_traits_.
  if (descriptor_->is_repeated()) {
    type_traits_ = "Repeated";
  }

  switch (descriptor_->cpp_type()) {
    case FieldDescriptor::CPPTYPE_ENUM:
      type_traits_.append("EnumTypeTraits< ");
      type_traits_.append(ClassName(descriptor_->enum_type(), true));
      type_traits_.append(", ");
      type_traits_.append(ClassName(descriptor_->enum_type(), true));
      type_traits_.append("_IsValid>");
      break;
    case FieldDescriptor::CPPTYPE_STRING:
      type_traits_.append("StringTypeTraits");
      break;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      type_traits_.append("MessageTypeTraits< ");
      type_traits_.append(ClassName(descriptor_->message_type(), true));
      type_traits_.append(" >");
      break;
    default:
      type_traits_.append("PrimitiveTypeTraits< ");
      type_traits_.append(PrimitiveTypeName(options_, descriptor_->cpp_type()));
      type_traits_.append(" >");
      break;
  }
  SetCommonVars(options, &variables_);
  variables_["extendee"] =
      QualifiedClassName(descriptor_->containing_type(), options_);
  variables_["type_traits"] = type_traits_;
  std::string name = descriptor_->name();
  variables_["name"] = ResolveKeyword(name);
  variables_["constant_name"] = FieldConstantName(descriptor_);
  variables_["field_type"] =
      StrCat(static_cast<int>(descriptor_->type()));
  variables_["packed"] = descriptor_->is_packed() ? "true" : "false";

  std::string scope =
      IsScoped() ? ClassName(descriptor_->extension_scope(), false) + "::" : "";
  variables_["scope"] = scope;
  variables_["scoped_name"] = ExtensionName(descriptor_);
  variables_["number"] = StrCat(descriptor_->number());
}